

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_env.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  long *plVar7;
  string example;
  ostringstream ss;
  char penv [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  char local_138 [264];
  
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,anon_var_dwarf_2626,anon_var_dwarf_2626 + 8);
  memset(local_138,0,0x100);
  std::operator+(&local_2f0,"NOWIDE_TEST2=",&local_2d0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_2a0 = *plVar7;
    lStack_298 = plVar3[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *plVar7;
    local_2b0 = (long *)*plVar3;
  }
  plVar1 = local_2b0;
  local_2a8 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  strncpy(local_138,(char *)local_2b0,0xff);
  if (plVar1 != &local_2a0) {
    operator_delete(plVar1,local_2a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_2f0._M_dataplus._M_p._1_7_,local_2f0._M_dataplus._M_p._0_1_) !=
      &local_2f0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_2f0._M_dataplus._M_p._1_7_,local_2f0._M_dataplus._M_p._0_1_),
                    local_2f0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = setenv("NOWIDE_TEST1",local_2d0._M_dataplus._M_p,1);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "Error nowide::setenv(\"NOWIDE_TEST1\",example.c_str(),1)==0 in ",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
               ,0x5f);
    local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2b0,(char *)&local_2f0,1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = getenv("NOWIDE_TEST1");
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"Error nowide::getenv(\"NOWIDE_TEST1\") in ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
               ,0x5f);
    local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2b0,(char *)&local_2f0,1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"Error nowide::getenv(\"NOWIDE_TEST1\")==example in ",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
               ,0x5f);
    local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2b0,(char *)&local_2f0,1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = setenv("NOWIDE_TEST1","xx",0);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"Error nowide::setenv(\"NOWIDE_TEST1\",\"xx\",0)==0 in ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
               ,0x5f);
    local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2b0,(char *)&local_2f0,1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  getenv("NOWIDE_TEST1");
  iVar2 = std::__cxx11::string::compare((char *)&local_2d0);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"Error nowide::getenv(\"NOWIDE_TEST1\")==example in ",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
               ,0x5f);
    local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2b0,(char *)&local_2f0,1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = putenv(local_138);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"Error nowide::putenv(penv)==0 in ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
               ,0x5f);
    local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2b0,(char *)&local_2f0,1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = getenv("NOWIDE_TEST2");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = getenv("NOWIDE_TEST_INVALID");
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b0,"Error nowide::getenv(\"NOWIDE_TEST_INVALID\")==0 in ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_2b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                 ,0x5f);
      local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_2b0,(char *)&local_2f0,1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,local_2d0._M_dataplus._M_p,
               local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
    std::__cxx11::string::append((char *)&local_2b0);
    iVar2 = std::__cxx11::string::compare((char *)&local_2b0);
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0 + 1);
    }
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,"Error nowide::getenv(\"NOWIDE_TEST2\")==example + \"x\" in ",
               0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
               ,0x5f);
    local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2b0,(char *)&local_2f0,1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b0,"Error nowide::getenv(\"NOWIDE_TEST2\") in ",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
             ,0x5f);
  local_2f0._M_dataplus._M_p._0_1_ = 0x3a;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_2b0,(char *)&local_2f0,1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&local_2f0);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd";
        char penv[256] = {0};
        strncpy(penv,("NOWIDE_TEST2=" + example + "x").c_str(),sizeof(penv)-1);
        
        TEST(nowide::setenv("NOWIDE_TEST1",example.c_str(),1)==0);
        TEST(nowide::getenv("NOWIDE_TEST1"));
        TEST(nowide::getenv("NOWIDE_TEST1")==example);
        TEST(nowide::setenv("NOWIDE_TEST1","xx",0)==0);
        TEST(nowide::getenv("NOWIDE_TEST1")==example);
        TEST(nowide::putenv(penv)==0);
        TEST(nowide::getenv("NOWIDE_TEST2"));
        TEST(nowide::getenv("NOWIDE_TEST_INVALID")==0);
        TEST(nowide::getenv("NOWIDE_TEST2")==example + "x");
        
        std::cout << "Ok" << std::endl;
        return 0;
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
}